

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

bool __thiscall
TPathFragmentTable::ComparePathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TStruct40 *pTVar1;
  bool bVar2;
  char *pcVar3;
  TStruct40 *pTVar4;
  TStruct40 *pStruct40;
  size_t nFragmentOffset_local;
  TMndxSearch *pSearch_local;
  TPathFragmentTable *this_local;
  
  pTVar1 = pSearch->pStruct40;
  bVar2 = TSparseArray::IsEmpty(&this->PathMarks);
  pStruct40 = (TStruct40 *)nFragmentOffset;
  if (bVar2) {
    do {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      if (*pcVar3 != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      pTVar1->PathLength = pTVar1->PathLength + 1;
      pStruct40 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      if (*pcVar3 == '\0') {
        return true;
      }
    } while ((ulong)pTVar1->PathLength < pSearch->cchSearchMask);
  }
  else {
    do {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      if (*pcVar3 != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      pTVar1->PathLength = pTVar1->PathLength + 1;
      pTVar4 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
      bVar2 = TSparseArray::IsItemPresent(&this->PathMarks,(size_t)pStruct40);
      if (bVar2) {
        return true;
      }
      pStruct40 = pTVar4;
    } while (pTVar4 < (TStruct40 *)pSearch->cchSearchMask);
  }
  return false;
}

Assistant:

bool ComparePathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if(PathMarks.IsEmpty())
        {
            // Keep searching as long as the name matches with the fragment
            while(PathFragments[nFragmentOffset] == pSearch->szSearchMask[pStruct40->PathLength])
            {
                // Move to the next character
                pStruct40->PathLength++;
                nFragmentOffset++;

                // Is it the end of the fragment or end of the path?
                if(PathFragments[nFragmentOffset] == 0)
                    return true;
                if(pStruct40->PathLength >= pSearch->cchSearchMask)
                    return false;
            }

            return false;
        }
        else
        {
            // Keep searching as long as the name matches with the fragment
            while(PathFragments[nFragmentOffset] == pSearch->szSearchMask[pStruct40->PathLength])
            {
                // Move to the next character
                pStruct40->PathLength++;

                // Is it the end of the path fragment?
                if(PathMarks.IsItemPresent(nFragmentOffset++))
                    return true;
                if(nFragmentOffset >= pSearch->cchSearchMask)
                    return false;
            }

            return false;
        }
    }